

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> __thiscall
wabt::MakeUnique<wabt::MemoryModuleField,wabt::Location>(wabt *this,Location *args)

{
  Location *loc;
  MemoryModuleField *this_00;
  string_view local_28;
  Location *local_18;
  Location *args_local;
  
  local_18 = args;
  args_local = (Location *)this;
  this_00 = (MemoryModuleField *)operator_new(0x78);
  loc = local_18;
  string_view::string_view(&local_28);
  MemoryModuleField::MemoryModuleField(this_00,loc,local_28);
  std::unique_ptr<wabt::MemoryModuleField,std::default_delete<wabt::MemoryModuleField>>::
  unique_ptr<std::default_delete<wabt::MemoryModuleField>,void>
            ((unique_ptr<wabt::MemoryModuleField,std::default_delete<wabt::MemoryModuleField>> *)
             this,this_00);
  return (__uniq_ptr_data<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}